

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O3

void Abc_NtkStartNameIds(Abc_Ntk_t *p)

{
  int iVar1;
  uint uVar2;
  long *plVar3;
  long *plVar4;
  void **ppvVar5;
  long lVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  FILE *__stream;
  Vec_Int_t *pVVar11;
  int *piVar12;
  Vec_Ptr_t *pVVar13;
  int iVar14;
  long lVar15;
  char pFileName [1000];
  char acStack_418 [1000];
  
  if (p->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                  ,0x2a9,"void Abc_NtkStartNameIds(Abc_Ntk_t *)");
  }
  if (p->vNameIds != (Vec_Int_t *)0x0) {
    __assert_fail("p->vNameIds == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                  ,0x2aa,"void Abc_NtkStartNameIds(Abc_Ntk_t *)");
  }
  pcVar9 = p->pSpec;
  sVar8 = strlen(pcVar9);
  if (999 < sVar8) {
    __assert_fail("strlen(p->pSpec) < 1000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                  ,0x2ab,"void Abc_NtkStartNameIds(Abc_Ntk_t *)");
  }
  pcVar9 = Extra_FileNameGenericAppend(pcVar9,"");
  pcVar10 = Extra_FileNameExtension(p->pSpec);
  sprintf(acStack_418,"%s_%s_names.txt",pcVar9,pcVar10);
  __stream = fopen(acStack_418,"wb");
  iVar14 = p->vObjs->nSize;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar14 - 1U) {
    iVar7 = iVar14;
  }
  pVVar11->nCap = iVar7;
  if (iVar7 == 0) {
    pVVar11->pArray = (int *)0x0;
    pVVar11->nSize = iVar14;
  }
  else {
    piVar12 = (int *)malloc((long)iVar7 << 2);
    pVVar11->pArray = piVar12;
    pVVar11->nSize = iVar14;
    if (piVar12 != (int *)0x0) {
      memset(piVar12,0,(long)iVar14 << 2);
    }
  }
  p->vNameIds = pVVar11;
  pVVar13 = p->vCis;
  if (pVVar13->nSize < 1) {
    iVar14 = 1;
  }
  else {
    iVar14 = 2;
    lVar15 = 0;
    do {
      plVar3 = (long *)pVVar13->pArray[lVar15];
      plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8);
      pcVar9 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar4 + 0x18),(int)plVar4[2]);
      fprintf(__stream,"%s            \n",pcVar9);
      iVar7 = (int)plVar3[2];
      if (((long)iVar7 < 0) || (pVVar11 = p->vNameIds, pVVar11->nSize <= iVar7)) goto LAB_00876cb2;
      pVVar11->pArray[iVar7] = iVar14;
      lVar15 = lVar15 + 1;
      pVVar13 = p->vCis;
      iVar14 = iVar14 + 2;
    } while (lVar15 < pVVar13->nSize);
    iVar14 = (int)lVar15 + 1;
  }
  pVVar13 = p->vCos;
  if (0 < pVVar13->nSize) {
    lVar15 = 0;
    do {
      plVar3 = *(long **)(*(long *)(*(long *)(*pVVar13->pArray[lVar15] + 0x20) + 8) +
                         (long)**(int **)((long)pVVar13->pArray[lVar15] + 0x20) * 8);
      plVar3 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
      iVar7 = (int)plVar3[2];
      if (((long)iVar7 < 0) || (pVVar11->nSize <= iVar7)) goto LAB_00876cd1;
      if (pVVar11->pArray[iVar7] == 0) {
        plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8);
        pcVar9 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar4 + 0x18),(int)plVar4[2]);
        fprintf(__stream,"%s            \n",pcVar9);
        iVar7 = (int)plVar3[2];
        if (((long)iVar7 < 0) || (pVVar11 = p->vNameIds, pVVar11->nSize <= iVar7))
        goto LAB_00876cb2;
        pVVar11->pArray[iVar7] = iVar14 * 2;
        pVVar13 = p->vCos;
        iVar14 = iVar14 + 1;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar13->nSize);
  }
  pVVar13 = Abc_NtkDfs(p,1);
  iVar7 = pVVar13->nSize;
  if (0 < iVar7) {
    pVVar11 = p->vNameIds;
    lVar15 = 0;
    do {
      plVar3 = (long *)pVVar13->pArray[lVar15];
      iVar1 = (int)plVar3[2];
      if (((long)iVar1 < 0) || (pVVar11->nSize <= iVar1)) goto LAB_00876cd1;
      if (pVVar11->pArray[iVar1] == 0) {
        plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8);
        pcVar9 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar4 + 0x18),(int)plVar4[2]);
        fprintf(__stream,"%s            \n",pcVar9);
        iVar7 = (int)plVar3[2];
        if (((long)iVar7 < 0) || (pVVar11 = p->vNameIds, pVVar11->nSize <= iVar7))
        goto LAB_00876cb2;
        pVVar11->pArray[iVar7] = iVar14 * 2;
        iVar7 = pVVar13->nSize;
        iVar14 = iVar14 + 1;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < iVar7);
  }
  if (pVVar13->pArray != (void **)0x0) {
    free(pVVar13->pArray);
  }
  free(pVVar13);
  fclose(__stream);
  pVVar13 = p->vCos;
  if (0 < pVVar13->nSize) {
    ppvVar5 = pVVar13->pArray;
    pVVar11 = p->vNameIds;
    lVar15 = 0;
    do {
      plVar3 = (long *)ppvVar5[lVar15];
      plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
      lVar6 = *(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8);
      iVar14 = *(int *)(lVar6 + 0x10);
      if (((long)iVar14 < 0) || (pVVar11->nSize <= iVar14)) {
LAB_00876cd1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar2 = *(uint *)(plVar3 + 2);
      if (((int)uVar2 < 0) || ((uint)pVVar11->nSize <= uVar2)) {
LAB_00876cb2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      piVar12 = pVVar11->pArray;
      piVar12[uVar2] = piVar12[iVar14];
      iVar14 = *(int *)(lVar6 + 0x10);
      if (((long)iVar14 < 0) || (pVVar11->nSize <= iVar14)) goto LAB_00876cb2;
      piVar12[iVar14] = 0;
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar13->nSize);
  }
  return;
}

Assistant:

void Abc_NtkStartNameIds( Abc_Ntk_t * p )
{
    char pFileName[1000];
    FILE * pFile;
    Abc_Obj_t * pObj, * pFanin;
    Vec_Ptr_t * vNodes;
    int i, Counter = 1;
    assert( Abc_NtkIsNetlist(p) );
    assert( p->vNameIds == NULL );
    assert( strlen(p->pSpec) < 1000 );
    sprintf( pFileName, "%s_%s_names.txt", Extra_FileNameGenericAppend(p->pSpec,""), Extra_FileNameExtension(p->pSpec) );
    pFile = fopen( pFileName, "wb" );
    p->vNameIds = Vec_IntStart( Abc_NtkObjNumMax(p) );
    // add inputs
    Abc_NtkForEachCi( p, pObj, i )
        fprintf( pFile, "%s            \n", Abc_ObjName(Abc_ObjFanout0(pObj)) ), Vec_IntWriteEntry(p->vNameIds, Abc_ObjId(pObj), 2*Counter++);
    // add outputs
    Abc_NtkForEachCo( p, pObj, i )
    {
        pFanin = Abc_ObjFanin0(Abc_ObjFanin0(pObj));
        if ( !Vec_IntEntry(p->vNameIds, Abc_ObjId(pFanin)) )
            fprintf( pFile, "%s            \n", Abc_ObjName(Abc_ObjFanout0(pFanin)) ), Vec_IntWriteEntry(p->vNameIds, Abc_ObjId(pFanin), 2*Counter++);
    }
    // add nodes in a topo order
    vNodes = Abc_NtkDfs( p, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        if ( !Vec_IntEntry(p->vNameIds, Abc_ObjId(pObj)) )
            fprintf( pFile, "%s            \n", Abc_ObjName(Abc_ObjFanout0(pObj)) ), Vec_IntWriteEntry(p->vNameIds, Abc_ObjId(pObj), 2*Counter++);
    Vec_PtrFree( vNodes );
    fclose( pFile );
    // transfer driver node names to COs
    Abc_NtkForEachCo( p, pObj, i )
    {
        pFanin = Abc_ObjFanin0(Abc_ObjFanin0(pObj));
        Vec_IntWriteEntry( p->vNameIds, Abc_ObjId(pObj), Vec_IntEntry(p->vNameIds, Abc_ObjId(pFanin)) );
        Vec_IntWriteEntry( p->vNameIds, Abc_ObjId(pFanin), 0 );
    }
}